

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

void __thiscall sqlite::Connection::Stmt::Stmt(Stmt *this,string *sql,Connection *db)

{
  int iVar1;
  sqlite3 *psVar2;
  string *sql_00;
  sqlite3 *__lhs;
  char *__rhs;
  Connection *in_RDX;
  string *in_RDI;
  int status;
  int sqlite_error_code;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  
  *(undefined8 *)in_RDI = 0;
  psVar2 = Connection::get_c_obj(in_RDX);
  *(sqlite3 **)(in_RDI + 8) = psVar2;
  psVar2 = Connection::get_c_obj(in_RDX);
  sql_00 = (string *)std::__cxx11::string::c_str();
  iVar1 = std::__cxx11::string::length();
  iVar1 = sqlite3_prepare_v2(psVar2,sql_00,iVar1 + 1,in_RDI,0);
  sqlite_error_code = (int)((ulong)psVar2 >> 0x20);
  if (iVar1 != 0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
    psVar2 = (sqlite3 *)__cxa_allocate_exception(0x48);
    s_abi_cxx11_(in_stack_ffffffffffffff98,CONCAT44(in_stack_ffffffffffffff94,uVar3));
    __lhs = Connection::get_c_obj(in_RDX);
    __rhs = (char *)sqlite3_errmsg(__lhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs)
    ;
    Logic_error::Logic_error
              ((Logic_error *)CONCAT44(in_stack_ffffffffffffff94,uVar3),in_RDI,sql_00,
               sqlite_error_code,psVar2);
    __cxa_throw(psVar2,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return;
}

Assistant:

Connection::Stmt::Stmt(const std::string & sql, Connection & db):
        db_(db.get_c_obj())
    {
        int status = sqlite3_prepare_v2(db.get_c_obj(), sql.c_str(), sql.length() + 1, &stmt_, NULL);

        if(status != SQLITE_OK)
        {
            throw Logic_error("Error parsing SQL: "s + sqlite3_errmsg(db.get_c_obj()), sql, status, db_);
        }
    }